

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leakagemodel.cpp
# Opt level: O2

double __thiscall
PowerLeakageModel::findFlow
          (PowerLeakageModel *this,double a,double b,double length,double h,double *dqdh)

{
  double dVar1;
  double dVar2;
  
  dVar2 = 0.0;
  dVar1 = 0.0;
  if (0.0 < h) {
    dVar1 = pow((this->super_LeakageModel).pressureUcf * h,b);
    dVar1 = ((dVar1 * a * length * (this->super_LeakageModel).lengthUcf) / 1000.0) /
            (this->super_LeakageModel).flowUcf;
    dVar2 = ((b * dVar1) / h) * 0.5;
  }
  *dqdh = dVar2;
  return dVar1;
}

Assistant:

double PowerLeakageModel::findFlow(double a, double b, double length, double h,
                                   double& dqdh)
{
    // no leakage for non-positive pressure head
    if ( h <= 0.0 )
    {
        dqdh = 0.0;
        return 0.0;
    }

    // ... find leakage using original units
    double q = a * pow(h * pressureUcf, b) * length * lengthUcf / 1000.0;

    // ... convert leakage to cfs
    q /= flowUcf;

    // ... compute half gradient in units of cfs/ft
    dqdh = b * q / h / 2.0;
    return q;
}